

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
testing::internal::
ParameterizedTestFactory<gurkenlaeufer::detail::CucumberTest_runStepsInScenario_Test>::
~ParameterizedTestFactory
          (ParameterizedTestFactory<gurkenlaeufer::detail::CucumberTest_runStepsInScenario_Test>
           *this)

{
  pointer pcVar1;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_001994a8;
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            (&(this->parameter_).mainSteps.
              super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>);
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            (&(this->parameter_).tags.
              super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>);
  pcVar1 = (this->parameter_).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->parameter_).description.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}